

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

void Iso_ManPrintClasses(Iso_Man_t *p,int fVerbose,int fVeryVerbose)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj;
  Iso_Obj_t *pIStack_30;
  int i;
  Iso_Obj_t *pTemp;
  Iso_Obj_t *pIso;
  int fOnlyCis;
  int fVeryVerbose_local;
  int fVerbose_local;
  Iso_Man_t *p_local;
  
  if (fVerbose != 0) {
    printf("Total objects =%7d.  Entries =%7d.  Classes =%7d.  Singles =%7d.\n",
           (ulong)(uint)p->nObjs,(ulong)(uint)p->nEntries,(ulong)(uint)p->nClasses,
           (ulong)(uint)p->nSingles);
  }
  if (fVeryVerbose != 0) {
    printf("Non-trivial classes:\n");
    for (pObj._4_4_ = 0; iVar3 = Vec_PtrSize(p->vClasses), (int)pObj._4_4_ < iVar3;
        pObj._4_4_ = pObj._4_4_ + 1) {
      pIStack_30 = (Iso_Obj_t *)Vec_PtrEntry(p->vClasses,pObj._4_4_);
      printf("%5d : {",(ulong)pObj._4_4_);
      for (; pIStack_30 != (Iso_Obj_t *)0x0; pIStack_30 = Iso_ManObj(p,pIStack_30->iClass)) {
        pAVar8 = Iso_AigObj(p,pIStack_30);
        iVar3 = Aig_ObjIsNode(pAVar8);
        if (iVar3 == 0) {
          uVar4 = Iso_ObjId(p,pIStack_30);
          printf(" %d",(ulong)uVar4);
        }
        else {
          uVar4 = Iso_ObjId(p,pIStack_30);
          iVar3 = Aig_ObjFaninC0(pAVar8);
          pcVar1 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
          if (iVar3 != 0) {
            pcVar1 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
          }
          uVar5 = Aig_ObjFaninId0(pAVar8);
          pObj_00 = Aig_ObjFanin0(pAVar8);
          uVar6 = Aig_ObjLevel(pObj_00);
          iVar3 = Aig_ObjFaninC1(pAVar8);
          pcVar2 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
          if (iVar3 != 0) {
            pcVar2 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
          }
          iVar3 = Aig_ObjFaninId1(pAVar8);
          pAVar8 = Aig_ObjFanin1(pAVar8);
          iVar7 = Aig_ObjLevel(pAVar8);
          printf(" %d{%s%d(%d),%s%d(%d)}",(ulong)uVar4,pcVar1 + 0x4a,(ulong)uVar5,(ulong)uVar6,
                 pcVar2 + 0x4a,iVar3,iVar7);
        }
        printf("(%d)",(ulong)(*(uint *)pIStack_30 & 0x3fffffff));
      }
      printf(" }\n");
    }
  }
  return;
}

Assistant:

void Iso_ManPrintClasses( Iso_Man_t * p, int fVerbose, int fVeryVerbose )
{
    int fOnlyCis = 0;
    Iso_Obj_t * pIso, * pTemp;
    int i;

    // count unique objects
    if ( fVerbose )
        printf( "Total objects =%7d.  Entries =%7d.  Classes =%7d.  Singles =%7d.\n", 
            p->nObjs, p->nEntries, p->nClasses, p->nSingles );

    if ( !fVeryVerbose )
        return;

    printf( "Non-trivial classes:\n" );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        if ( fOnlyCis && pIso->Level > 0 )
            continue;

        printf( "%5d : {", i );
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
        {
            if ( fOnlyCis )
                printf( " %d", Aig_ObjCioId( Iso_AigObj(p, pTemp) ) );
            else
            {
                Aig_Obj_t * pObj = Iso_AigObj(p, pTemp);
                if ( Aig_ObjIsNode(pObj) )
                    printf( " %d{%s%d(%d),%s%d(%d)}", Iso_ObjId(p, pTemp), 
                        Aig_ObjFaninC0(pObj)? "-": "+", Aig_ObjFaninId0(pObj), Aig_ObjLevel(Aig_ObjFanin0(pObj)), 
                        Aig_ObjFaninC1(pObj)? "-": "+", Aig_ObjFaninId1(pObj), Aig_ObjLevel(Aig_ObjFanin1(pObj)) );
                else
                    printf( " %d", Iso_ObjId(p, pTemp) );
            }
            printf( "(%d)", pTemp->Level );
        }        
        printf( " }\n" );
    }
}